

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_wrapper_check(void *p)

{
  long *plVar1;
  stb_malloc_record *psVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *file;
  int sz;
  char *p_00;
  char *pcVar6;
  int in_R8D;
  
  if (p != (void *)0x0) {
    iVar3 = stb__hashfind(p);
    if (iVar3 < 0) {
      pcVar6 = (char *)(ulong)(uint)stb__alloc_size;
      if (stb__alloc_size < 1) {
        pcVar6 = (char *)0x0;
      }
      file = (char *)0x0;
      do {
        pcVar5 = file + 0x18;
        p_00 = pcVar5;
        if ((char *)((long)pcVar6 * 0x18 + 0x18) == pcVar5) goto LAB_00152509;
        plVar1 = (long *)(file + (long)&stb__allocations->p);
        file = pcVar5;
      } while ((void *)*plVar1 != p);
      p_00 = (char *)p;
      stb_fatal("Internal error: pointer %p was allocated, but hash search failed");
      file = pcVar5;
LAB_00152509:
      uVar4 = stb__historyfind(p);
      if (-1 < (int)uVar4) {
        p_00 = (char *)(ulong)(uint)stb__alloc_history[uVar4].size;
        file = stb__alloc_history[uVar4].file;
        in_R8D = stb__alloc_history[uVar4].line;
        stb_fatal("Checked %d-byte block %p previously freed/realloced at %s:%d",p_00,p);
      }
      pcVar6 = "Checked unknown block %p";
      stb_fatal("Checked unknown block %p");
      if (pcVar6 == (char *)0x0) {
        stb_wrapper_malloc(p_00,sz,file,in_R8D);
        return;
      }
      if (p_00 != (char *)0x0) {
        iVar3 = stb__hashfind(pcVar6);
        psVar2 = stb__allocations;
        if (iVar3 == -1) {
          stb__historyfind(pcVar6);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x1d00,"void stb_wrapper_realloc(void *, void *, int, char *, int)");
        }
        if (p_00 != pcVar6) {
          stb__remove_alloc(iVar3,file,in_R8D);
          stb__add_alloc(p_00,sz,file,in_R8D);
          return;
        }
        stb__allocations[iVar3].size = sz;
        psVar2[iVar3].file = file;
        stb__allocations[iVar3].line = in_R8D;
      }
      return;
    }
  }
  return;
}

Assistant:

void stb_wrapper_check(void *p)
{
   int n;
   
   if (p == NULL) return;

   n = stb__hashfind(p);

   if (n >= 0) return;

   for (n=0; n < stb__alloc_size; ++n)
      if (stb__allocations[n].p == p)
         stb_fatal("Internal error: pointer %p was allocated, but hash search failed", p);

   // tried to free something that wasn't allocated!
   n = stb__historyfind(p);
   if (n >= 0)
      stb_fatal("Checked %d-byte block %p previously freed/realloced at %s:%d",
                    stb__alloc_history[n].size, p,
                    stb__alloc_history[n].file, stb__alloc_history[n].line);
   stb_fatal("Checked unknown block %p");
}